

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpChunkedEntityReader::tryRead
          (HttpChunkedEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  long *plVar1;
  PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *__return_storage_ptr__;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr___00;
  OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr___01;
  String *__return_storage_ptr___02;
  HttpInputStreamImpl *this_01;
  HttpInputStreamImpl *this_02;
  HttpEntityBodyReader *this_03;
  PromiseArenaMember *pPVar2;
  char *pcVar3;
  undefined8 uVar4;
  SourceLocation location;
  bool bVar5;
  coroutine_handle<void> coroutine;
  HttpInputStreamImpl *buffer_00;
  long lVar6;
  int iVar7;
  char (*params) [28];
  long in_R8;
  DebugExpression<bool_&> _kjCondition;
  Fault f;
  
  coroutine._M_fr_ptr = operator_new(0x6a8);
  *(code **)coroutine._M_fr_ptr = tryRead;
  *(code **)((long)coroutine._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(void **)((long)coroutine._M_fr_ptr + 0x670) = buffer;
  _kjCondition.value = (bool *)anon_var_dwarf_b0fe13;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706388;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007063d0;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x7fd;
  location.columnNumber = 0x13;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00706388;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_007063d0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyReader).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)this_00;
  _kjCondition.value = (bool *)((long)buffer + 0x20);
  if (*(char *)((long)buffer + 0x20) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[59]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x7fe,FAILED,"clean",
               "_kjCondition,\"can\'t read more data after a previous read didn\'t complete\"",
               &_kjCondition,
               (char (*) [59])"can\'t read more data after a previous read didn\'t complete");
    kj::_::Debug::Fault::fatal(&f);
  }
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x240);
  __return_storage_ptr___00 = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x438);
  __return_storage_ptr___01 =
       (OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError> *)((long)coroutine._M_fr_ptr + 0x5f8);
  __return_storage_ptr___02 = (String *)((long)coroutine._M_fr_ptr + 0x638);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x660);
  this_02 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x668);
  *_kjCondition.value = false;
  lVar6 = 0;
  do {
    *(void **)((long)coroutine._M_fr_ptr + 0x698) = buffer;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x690) = minBytes;
    *(size_t *)((long)coroutine._M_fr_ptr + 0x688) = maxBytes;
    *(long *)((long)coroutine._M_fr_ptr + 0x680) = lVar6;
    *(long *)((long)coroutine._M_fr_ptr + 0x678) = in_R8;
    while( true ) {
      this_03 = *(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x670);
      if ((this_03->weakInner).ptr == (HttpInputStreamImpl *)0x0) {
        uVar4 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x680);
        *(undefined1 *)&this_03[1].weakInner.ptr = 1;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x658) = uVar4;
        kj::_::Coroutine<unsigned_long>::fulfill
                  (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x658));
        goto LAB_0040f57c;
      }
      if (this_03[1].super_AsyncInputStream._vptr_AsyncInputStream != (_func_int **)0x0) break;
      HttpEntityBodyReader::getInner(this_03);
      HttpInputStreamImpl::readChunkHeader(this_01);
      co_await<kj::OneOf<unsigned_long,kj::HttpHeaders::ProtocolError>>
                (__return_storage_ptr__,
                 (Promise<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_> *)this_01);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 0;
      bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar5) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<kj::OneOf<unsigned_long,_kj::HttpHeaders::ProtocolError>_>::await_resume
                (__return_storage_ptr___01,__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x3f0) == '\x01') {
        if (*(int *)((long)coroutine._M_fr_ptr + 0x3f8) == 1) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
        }
        if (*(int *)((long)coroutine._M_fr_ptr + 0x3f8) == 2) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x3f8) = 0;
        }
      }
      if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      pPVar2 = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
      if (pPVar2 != (PromiseArenaMember *)0x0) {
        (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(pPVar2);
      }
      bVar5 = __return_storage_ptr___01->tag == 1;
      ((DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x6a1))->value = bVar5;
      if (!bVar5) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[11]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x80a,FAILED,"nextChunkSizeOrError.is<uint64_t>()","_kjCondition,\"bad header\""
                   ,(DebugExpression<bool> *)((long)coroutine._M_fr_ptr + 0x6a1),
                   (char (*) [11])"bad header");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x600);
      if (lVar6 == 0) {
        HttpEntityBodyReader::doneReading
                  (*(HttpEntityBodyReader **)((long)coroutine._M_fr_ptr + 0x670));
      }
      *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18) = lVar6;
      if (*(int *)((long)coroutine._M_fr_ptr + 0x5f8) == 1) {
        __return_storage_ptr___01->tag = 0;
      }
      if (__return_storage_ptr___01->tag == 2) {
        __return_storage_ptr___01->tag = 0;
      }
    }
    buffer_00 = HttpEntityBodyReader::getInner(this_03);
    params = (char (*) [28])0x1;
    HttpInputStreamImpl::tryRead(this_02,buffer_00,*(size_t *)((long)coroutine._M_fr_ptr + 0x690),1)
    ;
    co_await<unsigned_long>(__return_storage_ptr___00,(Promise<unsigned_long> *)this_02);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 1;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    buffer = (void *)kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr___00);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x450) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x458));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___00);
    pPVar2 = (PromiseArenaMember *)(this_02->super_HttpInputStream)._vptr_HttpInputStream;
    if (pPVar2 != (PromiseArenaMember *)0x0) {
      (this_02->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(pPVar2);
    }
    plVar1 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x18);
    *plVar1 = *plVar1 - (long)buffer;
    if (buffer == (void *)0x0) {
      kj::_::Debug::makeDescription<char_const(&)[28]>
                (__return_storage_ptr___02,(Debug *)"\"premature EOF in HTTP chunk\"",
                 "premature EOF in HTTP chunk",params);
      Exception::Exception
                ((Exception *)__return_storage_ptr__,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x81a,__return_storage_ptr___02);
      throwRecoverableException((Exception *)__return_storage_ptr__,0);
      Exception::~Exception((Exception *)__return_storage_ptr__);
      pcVar3 = (__return_storage_ptr___02->content).ptr;
      if (pcVar3 != (char *)0x0) {
        uVar4 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x640);
        (__return_storage_ptr___02->content).ptr = (char *)0x0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x640) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x648))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x648),pcVar3,1,uVar4,uVar4,0);
      }
LAB_0040f4c4:
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x680);
      *(undefined1 *)(*(long *)((long)coroutine._M_fr_ptr + 0x670) + 0x20) = 1;
      *(long *)((long)coroutine._M_fr_ptr + 0x650) = lVar6 + (long)buffer;
      kj::_::Coroutine<unsigned_long>::fulfill
                (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x650));
      minBytes = *(size_t *)((long)coroutine._M_fr_ptr + 0x690);
      maxBytes = *(size_t *)((long)coroutine._M_fr_ptr + 0x688);
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x678);
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x680);
      iVar7 = 3;
    }
    else {
      maxBytes = (long)*(void **)((long)coroutine._M_fr_ptr + 0x688) - (long)buffer;
      if (*(void **)((long)coroutine._M_fr_ptr + 0x688) < buffer || maxBytes == 0)
      goto LAB_0040f4c4;
      minBytes = *(long *)((long)coroutine._M_fr_ptr + 0x690) + (long)buffer;
      in_R8 = *(long *)((long)coroutine._M_fr_ptr + 0x678) - (long)buffer;
      lVar6 = *(long *)((long)coroutine._M_fr_ptr + 0x680) + (long)buffer;
      iVar7 = 8;
    }
    if (iVar7 != 8) {
      if (iVar7 == 3) {
LAB_0040f57c:
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x6a0) = 2;
      }
      else {
        if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true)
        {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
        }
        kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
        operator_delete(coroutine._M_fr_ptr,0x6a8);
      }
      return (PromiseBase)(PromiseBase)this;
    }
  } while( true );
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(clean, "can't read more data after a previous read didn't complete");
    clean = false;

    size_t alreadyRead = 0;

    for (;;) {
      if (alreadyDone()) {
        clean = true;
        co_return alreadyRead;
      } else if (chunkSize == 0) {
        // Read next chunk header.
        auto nextChunkSizeOrError = co_await getInner().readChunkHeader();
        KJ_REQUIRE(nextChunkSizeOrError.is<uint64_t>(), "bad header");
        auto nextChunkSize = nextChunkSizeOrError.get<uint64_t>();
        if (nextChunkSize == 0) {
          doneReading();
        }

        chunkSize = nextChunkSize;
        continue;
      } else {
        // Read current chunk.
        // We have to set minBytes to 1 here so that if we read any data at all, we update our
        // counter immediately, so that we still know where we are in case of cancellation.
        auto amount = co_await getInner().tryRead(buffer, 1, kj::min(maxBytes, chunkSize));

        chunkSize -= amount;
        if (amount == 0) {
          kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "premature EOF in HTTP chunk"));
        } else if (amount < minBytes) {
          // We requested a minimum 1 byte above, but our own caller actually set a larger minimum
          // which has not yet been reached. Keep trying until we reach it.
          buffer = reinterpret_cast<byte*>(buffer) + amount;
          minBytes -= amount;
          maxBytes -= amount;
          alreadyRead += amount;
          continue;
        }
        clean = true;
        co_return alreadyRead + amount;
      }
    }
  }